

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSplitLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Rep *pRVar2;
  key_type *__k;
  string *psVar3;
  pointer pcVar4;
  bool bVar5;
  LogMessage *pLVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  long *plVar9;
  _Rb_tree_header *p_Var10;
  size_type *psVar11;
  long lVar12;
  long lVar13;
  void **ppvVar14;
  string err;
  pointer local_118;
  _Alloc_hider local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  undefined1 local_f0 [8];
  _Alloc_hider local_e8;
  undefined1 local_e0 [44];
  mapped_type local_b4;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Result::Result((Result *)&local_118);
  validateInputCount((Result *)local_f0,layer,1,1);
  local_118 = (pointer)local_f0;
  std::__cxx11::string::operator=((string *)&local_110,(string *)&local_e8);
  pcVar4 = local_e0 + 8;
  if (local_e8._M_p != pcVar4) {
    operator_delete(local_e8._M_p,local_e0._8_8_ + 1);
  }
  bVar5 = Result::good((Result *)&local_118);
  if (bVar5) {
    validateOutputCount((Result *)local_f0,layer,2,-1);
    local_118 = (pointer)local_f0;
    std::__cxx11::string::operator=((string *)&local_110,(string *)&local_e8);
    if (local_e8._M_p != pcVar4) {
      operator_delete(local_e8._M_p,local_e0._8_8_ + 1);
    }
  }
  bVar5 = Result::good((Result *)&local_118);
  if ((bVar5) && (this->ndArrayInterpretation == true)) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Split","");
    this_00 = &this->blobNameToRank;
    validateInputOutputRankEquality((Result *)local_f0,layer,&local_70,this_00);
    local_118 = (pointer)local_f0;
    std::__cxx11::string::operator=((string *)&local_110,(string *)&local_e8);
    if (local_e8._M_p != pcVar4) {
      operator_delete(local_e8._M_p,local_e0._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    bVar5 = Result::good((Result *)&local_118);
    if (bVar5) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Split","");
      validateRankCount((Result *)local_f0,layer,&local_b0,3,-1,this_00);
      local_118 = (pointer)local_f0;
      std::__cxx11::string::operator=((string *)&local_110,(string *)&local_e8);
      if (local_e8._M_p != pcVar4) {
        operator_delete(local_e8._M_p,local_e0._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      bVar5 = Result::good((Result *)&local_118);
      if (bVar5) {
        if ((layer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_f0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar6 = google::protobuf::internal::LogMessage::operator<<
                             ((LogMessage *)local_f0,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_b0,pLVar6);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_f0);
        }
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&this_00->_M_t,
                       (key_type *)((layer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
        p_Var10 = &(this->blobNameToRank)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)iVar7._M_node != p_Var10) {
          if ((layer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)local_f0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x5ca);
            pLVar6 = google::protobuf::internal::LogMessage::operator<<
                               ((LogMessage *)local_f0,"CHECK failed: (index) < (current_size_): ");
            google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_b0,pLVar6);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_f0);
          }
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::at(this_00,(key_type *)
                                ((layer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
          pRVar2 = (layer->output_).super_RepeatedPtrFieldBase.rep_;
          ppvVar14 = pRVar2->elements;
          if (pRVar2 == (Rep *)0x0) {
            ppvVar14 = (void **)0x0;
          }
          lVar13 = (long)(layer->output_).super_RepeatedPtrFieldBase.current_size_;
          if (lVar13 != 0) {
            local_b4 = *pmVar8;
            lVar12 = 0;
            do {
              __k = *(key_type **)((long)ppvVar14 + lVar12);
              iVar7 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::find(&this_00->_M_t,__k);
              if (((_Rb_tree_header *)iVar7._M_node != p_Var10) &&
                 (pmVar8 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           ::at(this_00,__k), local_b4 != *pmVar8)) {
                local_e8._M_p = (pointer)0x0;
                local_e0[0] = '\0';
                psVar3 = (layer->name_).ptr_;
                pcVar4 = (psVar3->_M_dataplus)._M_p;
                local_f0 = (undefined1  [8])local_e0;
                local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_90,pcVar4,pcVar4 + psVar3->_M_string_length);
                std::operator+(&local_50,"Layer \'",&local_90);
                plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
                psVar11 = (size_type *)(plVar9 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar9 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar11) {
                  local_b0.field_2._M_allocated_capacity = *psVar11;
                  local_b0.field_2._8_8_ = plVar9[3];
                  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
                }
                else {
                  local_b0.field_2._M_allocated_capacity = *psVar11;
                  local_b0._M_dataplus._M_p = (pointer)*plVar9;
                }
                local_b0._M_string_length = plVar9[1];
                *plVar9 = (long)psVar11;
                plVar9[1] = 0;
                *(undefined1 *)(plVar9 + 2) = 0;
                std::__cxx11::string::operator=((string *)local_f0,(string *)&local_b0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                  operator_delete(local_b0._M_dataplus._M_p,
                                  local_b0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_90._M_dataplus._M_p != &local_90.field_2) {
                  operator_delete(local_90._M_dataplus._M_p,
                                  local_90.field_2._M_allocated_capacity + 1);
                }
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_f0);
                if (local_f0 != (undefined1  [8])local_e0) {
                  operator_delete((void *)local_f0,CONCAT71(local_e0._1_7_,local_e0[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_110._M_p == &local_100) {
                  return __return_storage_ptr__;
                }
                operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
                return __return_storage_ptr__;
              }
              lVar12 = lVar12 + 8;
            } while (lVar13 * 8 != lVar12);
          }
        }
      }
    }
  }
  *(pointer *)__return_storage_ptr__ = local_118;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_p == &local_100) {
    paVar1->_M_allocated_capacity = local_100._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_100._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_110._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         local_100._M_allocated_capacity;
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_108;
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSplitLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        // between 2 and any number of outputs
        r = validateOutputCount(layer, 2, -1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Split", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Split", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}

        // check that all outputs have same rank
        int rank = 0;
        if (blobNameToRank.find(layer.output(0)) != blobNameToRank.end()) {
            rank = blobNameToRank.at(layer.output(0));
        } else {
            return r;
        }

        for (const auto& output : layer.output()) {
            if (blobNameToRank.find(output) != blobNameToRank.end()) {
                if (rank != blobNameToRank.at(output)) {
                    std::string err;
                    err = "Layer '" + std::string(layer.name()) + "' of type 'Split' must have equal ranks for its outputs, but they are not equal.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    return r;
}